

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

char * xmlRelaxNGDefName(xmlRelaxNGDefinePtr_conflict def)

{
  xmlRelaxNGDefinePtr_conflict def_local;
  
  if (def == (xmlRelaxNGDefinePtr_conflict)0x0) {
    def_local = (xmlRelaxNGDefinePtr_conflict)anon_var_dwarf_f800;
  }
  else {
    switch(def->type) {
    case XML_RELAXNG_EMPTY:
      def_local = (xmlRelaxNGDefinePtr_conflict)0x254c10;
      break;
    case XML_RELAXNG_NOT_ALLOWED:
      def_local = (xmlRelaxNGDefinePtr_conflict)anon_var_dwarf_51787;
      break;
    case XML_RELAXNG_EXCEPT:
      def_local = (xmlRelaxNGDefinePtr_conflict)anon_var_dwarf_51372;
      break;
    case XML_RELAXNG_TEXT:
      def_local = (xmlRelaxNGDefinePtr_conflict)0x244f30;
      break;
    case XML_RELAXNG_ELEMENT:
      def_local = (xmlRelaxNGDefinePtr_conflict)0x2561a5;
      break;
    case XML_RELAXNG_DATATYPE:
      def_local = (xmlRelaxNGDefinePtr_conflict)anon_var_dwarf_51ddc;
      break;
    case XML_RELAXNG_PARAM:
      def_local = (xmlRelaxNGDefinePtr_conflict)anon_var_dwarf_38e03;
      break;
    case XML_RELAXNG_VALUE:
      def_local = (xmlRelaxNGDefinePtr_conflict)0x238b64;
      break;
    case XML_RELAXNG_LIST:
      def_local = (xmlRelaxNGDefinePtr_conflict)0x25508b;
      break;
    case XML_RELAXNG_ATTRIBUTE:
      def_local = (xmlRelaxNGDefinePtr_conflict)0x254d88;
      break;
    case XML_RELAXNG_DEF:
      def_local = (xmlRelaxNGDefinePtr_conflict)anon_var_dwarf_51de8;
      break;
    case XML_RELAXNG_REF:
      def_local = (xmlRelaxNGDefinePtr_conflict)0x24f001;
      break;
    case XML_RELAXNG_EXTERNALREF:
      def_local = (xmlRelaxNGDefinePtr_conflict)anon_var_dwarf_51234;
      break;
    case XML_RELAXNG_PARENTREF:
      def_local = (xmlRelaxNGDefinePtr_conflict)0x24f00e;
      break;
    case XML_RELAXNG_OPTIONAL:
      def_local = (xmlRelaxNGDefinePtr_conflict)anon_var_dwarf_516f2;
      break;
    case XML_RELAXNG_ZEROORMORE:
      def_local = (xmlRelaxNGDefinePtr_conflict)anon_var_dwarf_516c5;
      break;
    case XML_RELAXNG_ONEORMORE:
      def_local = (xmlRelaxNGDefinePtr_conflict)anon_var_dwarf_516e7;
      break;
    case XML_RELAXNG_CHOICE:
      def_local = (xmlRelaxNGDefinePtr_conflict)anon_var_dwarf_51640;
      break;
    case XML_RELAXNG_GROUP:
      def_local = (xmlRelaxNGDefinePtr_conflict)0x251acb;
      break;
    case XML_RELAXNG_INTERLEAVE:
      def_local = (xmlRelaxNGDefinePtr_conflict)anon_var_dwarf_5177b;
      break;
    case XML_RELAXNG_START:
      def_local = (xmlRelaxNGDefinePtr_conflict)anon_var_dwarf_5140e;
      break;
    case XML_RELAXNG_NOOP:
      def_local = (xmlRelaxNGDefinePtr_conflict)anon_var_dwarf_51df4;
      break;
    default:
      def_local = (xmlRelaxNGDefinePtr_conflict)anon_var_dwarf_51e00;
    }
  }
  return (char *)def_local;
}

Assistant:

static const char *
xmlRelaxNGDefName(xmlRelaxNGDefinePtr def)
{
    if (def == NULL)
        return ("none");
    switch (def->type) {
        case XML_RELAXNG_EMPTY:
            return ("empty");
        case XML_RELAXNG_NOT_ALLOWED:
            return ("notAllowed");
        case XML_RELAXNG_EXCEPT:
            return ("except");
        case XML_RELAXNG_TEXT:
            return ("text");
        case XML_RELAXNG_ELEMENT:
            return ("element");
        case XML_RELAXNG_DATATYPE:
            return ("datatype");
        case XML_RELAXNG_VALUE:
            return ("value");
        case XML_RELAXNG_LIST:
            return ("list");
        case XML_RELAXNG_ATTRIBUTE:
            return ("attribute");
        case XML_RELAXNG_DEF:
            return ("def");
        case XML_RELAXNG_REF:
            return ("ref");
        case XML_RELAXNG_EXTERNALREF:
            return ("externalRef");
        case XML_RELAXNG_PARENTREF:
            return ("parentRef");
        case XML_RELAXNG_OPTIONAL:
            return ("optional");
        case XML_RELAXNG_ZEROORMORE:
            return ("zeroOrMore");
        case XML_RELAXNG_ONEORMORE:
            return ("oneOrMore");
        case XML_RELAXNG_CHOICE:
            return ("choice");
        case XML_RELAXNG_GROUP:
            return ("group");
        case XML_RELAXNG_INTERLEAVE:
            return ("interleave");
        case XML_RELAXNG_START:
            return ("start");
        case XML_RELAXNG_NOOP:
            return ("noop");
        case XML_RELAXNG_PARAM:
            return ("param");
    }
    return ("unknown");
}